

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::Scene::readFrom(Scene *this,BinaryReader *binary)

{
  BinaryReader::read<pbrt::Film>(binary,&this->film);
  BinaryReader::
  read<std::shared_ptr<pbrt::Camera>,std::allocator<std::shared_ptr<pbrt::Camera>>,void,void>
            (binary,&this->cameras);
  BinaryReader::read<pbrt::Object>(binary,&this->world);
  return;
}

Assistant:

void Scene::readFrom(BinaryReader &binary) 
  {
    binary.read(film);
    binary.read(cameras);
    binary.read(world);
  }